

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationBounds_Test::TestBody
          (TimeUtilTest_DurationBounds_Test *this)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  pointer pcVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  StringLike<const_char_*> *regex_06;
  StringLike<const_char_*> *regex_07;
  StringLike<const_char_*> *regex_08;
  StringLike<const_char_*> *regex_09;
  StringLike<const_char_*> *regex_10;
  StringLike<const_char_*> *regex_11;
  StringLike<const_char_*> *regex_12;
  element_type *peVar7;
  DeathTest *gtest_dt;
  Duration underflow;
  Duration overflow;
  Duration underflow_nanos;
  Duration overflow_nanos;
  element_type *local_338;
  AssertHelper local_330;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_328;
  Duration local_308;
  Duration local_2e0;
  Duration local_2b8;
  Duration local_290;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_268;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_250;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_238;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_220;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_208;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_190;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_160;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_148;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  Duration local_118;
  Duration local_f0;
  Duration local_c8;
  Duration local_a0;
  Duration local_78;
  Duration local_50;
  
  Duration::Duration(&local_2e0,(Arena *)0x0);
  local_2e0.field_0._impl_.seconds_ = 0x4979cb9e01;
  local_2e0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2e0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&local_308,(Arena *)0x0);
  local_308.field_0._impl_.seconds_ = -0x4979cb9e01;
  local_308.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_308.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&local_290,(Arena *)0x0);
  local_290.field_0._impl_.nanos_ = 1000000000;
  local_290.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_290.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  Duration::Duration(&local_2b8,(Arena *)0x0);
  local_2b8.field_0._impl_.nanos_ = -1000000000;
  local_2b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1237257;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_130,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(overflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_130,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ad,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_130);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bab532;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bab532;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::SecondsToDuration(&local_50,local_2e0.field_0._impl_.seconds_);
          Duration::~Duration(&local_50);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bab585;
    }
  }
  else {
LAB_00bab532:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ad,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bab585:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1237257;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_148,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(underflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1af,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_148);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bab6a5;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bab6a5;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::SecondsToDuration(&local_78,local_308.field_0._impl_.seconds_);
          Duration::~Duration(&local_78);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bab6f8;
    }
  }
  else {
LAB_00bab6a5:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bab6f8:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x12372dc;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_160,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_160,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b2,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_160);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bab841;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bab841;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::MinutesToDuration(&local_a0,local_2e0.field_0._impl_.seconds_ / 0x3c + 1);
          Duration::~Duration(&local_a0);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bab894;
    }
  }
  else {
LAB_00bab841:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bab894:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x12372dc;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_178,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b5,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_178);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bab9dd;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bab9dd;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::MinutesToDuration(&local_c8,local_308.field_0._impl_.seconds_ / 0x3c + -1);
          Duration::~Duration(&local_c8);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00baba30;
    }
  }
  else {
LAB_00bab9dd:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00baba30:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1237368;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_190,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_190,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b8,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_190);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00babb79;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00babb79;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::HoursToDuration(&local_f0,local_2e0.field_0._impl_.seconds_ / 0x3c + 1);
          Duration::~Duration(&local_f0);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00babbcc;
    }
  }
  else {
LAB_00babb79:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00babbcc:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1237368;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1a8,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1bb,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1a8);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00babd15;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00babd15;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::HoursToDuration(&local_118,local_308.field_0._impl_.seconds_ / 0x3c + -1);
          Duration::~Duration(&local_118);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00babd68;
    }
  }
  else {
LAB_00babd15:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1bb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00babd68:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_05);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1c0,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1be,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1c0);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00babe73;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00babe73;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&local_2e0);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00babec6;
    }
  }
  else {
LAB_00babe73:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00babec6:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_06);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1d8,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c0,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1d8);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00babfd1;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00babfd1;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&local_308);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac024;
    }
  }
  else {
LAB_00babfd1:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac024:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_07);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1f0,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c2,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1f0);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac132;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bac132;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&local_290);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac185;
    }
  }
  else {
LAB_00bac132:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac185:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_08);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_208,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_208,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c4,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_208);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac293;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bac293;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&local_2b8);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac2e6;
    }
  }
  else {
LAB_00bac293:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac2e6:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_09);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_220,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_220,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c6,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_220);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac3f1;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bac3f1;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&local_2e0);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac444;
    }
  }
  else {
LAB_00bac3f1:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac444:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_10);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_238,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c8,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_238);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac54f;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bac54f;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&local_308);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac5a2;
    }
  }
  else {
LAB_00bac54f:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac5a2:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_11);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_250,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ca,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_250);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac6b0;
    if (local_338 != (element_type *)0x0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
      peVar1 = local_338;
      if (iVar4 == 0) {
        iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x20))(peVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
          goto LAB_00bac6b0;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&local_290);
        }
        (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
        (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
      }
      pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
      goto LAB_00bac703;
    }
  }
  else {
LAB_00bac6b0:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ca,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pcVar6 = ((local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->pattern_)._M_dataplus._M_p;
      peVar7 = local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00bac703:
      (**(code **)(pcVar6 + 8))(peVar7);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_330.data_ = (AssertHelperData *)0x1414782;
    testing::ContainsRegex<char_const*>(&local_328,(testing *)&local_330,regex_12);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_268,(PolymorphicMatcher *)&local_328);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_328.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1cc,(DeathTest **)&local_338);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_268);
    peVar7 = local_338;
    if (!bVar2) goto LAB_00bac811;
    if (local_338 == (element_type *)0x0) goto LAB_00bac867;
    iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x10))(local_338);
    peVar1 = local_338;
    if (iVar4 == 0) {
      iVar4 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x18))(local_338);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x20))(local_338,bVar2);
      if (cVar3 == '\0') {
        (**(code **)((peVar7->pattern_)._M_dataplus._M_p + 8))(peVar7);
        goto LAB_00bac811;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        TimeUtil::DurationToSeconds(&local_2b8);
      }
      (**(code **)((local_338->pattern_)._M_dataplus._M_p + 0x28))(local_338,2);
      (**(code **)((peVar1->pattern_)._M_dataplus._M_p + 0x28))(peVar1,0);
    }
    pcVar6 = (peVar7->pattern_)._M_dataplus._M_p;
    local_328.impl_.regex_.
    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
  }
  else {
LAB_00bac811:
    testing::Message::Message((Message *)&local_328);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1cc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (local_328.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00bac867;
    pcVar6 = ((local_328.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_)._M_dataplus._M_p;
  }
  (**(code **)(pcVar6 + 8))
            (local_328.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_00bac867:
  Duration::~Duration(&local_2b8);
  Duration::~Duration(&local_290);
  Duration::~Duration(&local_308);
  Duration::~Duration(&local_2e0);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationBounds) {
  Duration overflow;
  overflow.set_seconds(TimeUtil::kDurationMaxSeconds + 1);
  Duration underflow;
  underflow.set_seconds(TimeUtil::kDurationMinSeconds - 1);
  Duration overflow_nanos;
  overflow_nanos.set_nanos(TimeUtil::kDurationMaxNanoseconds + 1);
  Duration underflow_nanos;
  underflow_nanos.set_nanos(TimeUtil::kDurationMinNanoseconds - 1);

  EXPECT_DEATH({ TimeUtil::SecondsToDuration(overflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH({ TimeUtil::SecondsToDuration(underflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); },
      "Duration hours");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); },
      "Duration hours");

  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow_nanos); },
                     "outside of the valid range");
}